

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

bool google::protobuf::safe_parse_positive_int<long>(string *text,long *value_p)

{
  undefined1 auVar1 [16];
  int iVar2;
  long lVar3;
  byte *pbVar4;
  long *in_RSI;
  int digit;
  uchar c;
  char *end;
  char *start;
  long vmax_over_base;
  long vmax;
  long value;
  int base;
  byte *local_40;
  long local_28;
  
  local_28 = 0;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = SUB168(SEXT816(0x7fffffffffffffff),8);
  local_40 = (byte *)std::__cxx11::string::data();
  lVar3 = std::__cxx11::string::size();
  pbVar4 = local_40 + lVar3;
  while( true ) {
    if (pbVar4 <= local_40) {
      *in_RSI = local_28;
      return true;
    }
    iVar2 = *local_40 - 0x30;
    if ((9 < iVar2) || (iVar2 < 0)) {
      *in_RSI = local_28;
      return false;
    }
    if (SUB168((auVar1 << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(10),0) < local_28) {
      *in_RSI = 0x7fffffffffffffff;
      return false;
    }
    if (0x7fffffffffffffff - (long)iVar2 < local_28 * 10) break;
    local_28 = (long)iVar2 + local_28 * 10;
    local_40 = local_40 + 1;
  }
  *in_RSI = 0x7fffffffffffffff;
  return false;
}

Assistant:

bool safe_parse_positive_int(std::string text, IntType *value_p) {
  int base = 10;
  IntType value = 0;
  const IntType vmax = std::numeric_limits<IntType>::max();
  assert(vmax > 0);
  assert(vmax >= base);
  const IntType vmax_over_base = vmax / base;
  const char* start = text.data();
  const char* end = start + text.size();
  // loop over digits
  for (; start < end; ++start) {
    unsigned char c = static_cast<unsigned char>(start[0]);
    int digit = c - '0';
    if (digit >= base || digit < 0) {
      *value_p = value;
      return false;
    }
    if (value > vmax_over_base) {
      *value_p = vmax;
      return false;
    }
    value *= base;
    if (value > vmax - digit) {
      *value_p = vmax;
      return false;
    }
    value += digit;
  }
  *value_p = value;
  return true;
}